

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O0

void __thiscall
gl4cts::IncompleteTextureAccess::SamplerTest::PrepareTexture
          (SamplerTest *this,Configuration configuration)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 *puVar5;
  Functions *gl;
  SamplerTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (this->m_to != 0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_to);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cIncompleteTextureAccessTests.cpp"
                  ,0x143);
  (**(code **)(lVar4 + 0xb8))(configuration.texture_target,this->m_to);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cIncompleteTextureAccessTests.cpp"
                  ,0x146);
  return;
}

Assistant:

void SamplerTest::PrepareTexture(Configuration configuration)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_to)
	{
		throw 0;
	}

	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(configuration.texture_target, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");
}